

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall crnlib::dxt_hc::~dxt_hc(dxt_hc *this)

{
  vector<crnlib::dxt_hc::alpha_cluster> *pvVar1;
  vector<crnlib::dxt_hc::alpha_cluster> *in_RDI;
  uint *local_10;
  
  vector<crnlib::dxt_hc::alpha_cluster>::~vector(in_RDI);
  vector<crnlib::dxt_hc::color_cluster>::~vector((vector<crnlib::dxt_hc::color_cluster> *)in_RDI);
  vector<crnlib::dxt_hc::selector_indices_details>::~vector
            ((vector<crnlib::dxt_hc::selector_indices_details> *)in_RDI);
  vector<crnlib::dxt_hc::endpoint_indices_details>::~vector
            ((vector<crnlib::dxt_hc::endpoint_indices_details> *)in_RDI);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_RDI);
  vector<bool>::~vector((vector<bool> *)in_RDI);
  vector<bool>::~vector((vector<bool> *)in_RDI);
  vector<unsigned_long_long>::~vector((vector<unsigned_long_long> *)in_RDI);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_RDI);
  pvVar1 = in_RDI + 0x66;
  local_10 = &in_RDI[0x69].m_size;
  do {
    local_10 = local_10 + -4;
    vector<unsigned_long_long>::~vector((vector<unsigned_long_long> *)in_RDI);
  } while (local_10 != &pvVar1->m_size);
  vector<unsigned_char>::~vector((vector<unsigned_char> *)in_RDI);
  vector<float>::~vector((vector<float> *)in_RDI);
  vector<crnlib::dxt_hc::tile_details>::~vector((vector<crnlib::dxt_hc::tile_details> *)in_RDI);
  return;
}

Assistant:

dxt_hc::~dxt_hc() {
}